

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O0

void __thiscall
MethodProperty_GetConvertReference_Test::~MethodProperty_GetConvertReference_Test
          (MethodProperty_GetConvertReference_Test *this)

{
  MethodProperty_GetConvertReference_Test *this_local;
  
  ~MethodProperty_GetConvertReference_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MethodProperty, GetConvertReference)
{
  BasicMethodProperties obj;
  
  const int& ro_int_value_cref = obj.ro_int_value;
  const int& ro_int_value_cref2 = obj.ro_int_value2;
  const int& int_value_cref = obj.int_value;
  const int& int_value_cref2 = obj.int_value2;
  const int& int_value_cref3 = obj.int_value3;
  const std::string& ro_string_value_cref = obj.ro_string_value;
  const std::string& ro_string_value_cref2 = obj.ro_string_value2;
  const std::string& string_value_cref = obj.string_value;
  const std::string& string_value_cref2 = obj.string_value2;
  const std::string& string_value_cref3 = obj.string_value3;
  
  EXPECT_EQ( 0, ro_int_value_cref );
  EXPECT_EQ( 0, ro_int_value_cref2 );
  EXPECT_EQ( 0, int_value_cref );
  EXPECT_EQ( 0, int_value_cref2 );
  EXPECT_EQ( 0, int_value_cref3 );
  EXPECT_EQ( "", ro_string_value_cref );
  EXPECT_EQ( "", ro_string_value_cref2 );
  EXPECT_EQ( "", string_value_cref );
  EXPECT_EQ( "", string_value_cref2 );
  EXPECT_EQ( "", string_value_cref3 );
  
  obj.getIntValueTest() = 86;
  obj.getStringValueTest() = "bob";
  obj.getIntValue2Test() = 74;
  obj.getStringValue2Test() = "bill";
  
  EXPECT_EQ( 0, ro_int_value_cref );
  EXPECT_EQ( 0, ro_int_value_cref2 );
  EXPECT_EQ( 0, int_value_cref );
  EXPECT_EQ( 0, int_value_cref2 );
  EXPECT_EQ( 0, int_value_cref3 );
  EXPECT_EQ( "", ro_string_value_cref );
  EXPECT_EQ( "", ro_string_value_cref2 );
  EXPECT_EQ( "", string_value_cref );
  EXPECT_EQ( "", string_value_cref2 );
  EXPECT_EQ( "", string_value_cref3 );
  
  const long long& ro_long_value_cref = obj.ro_int_value;
  const long long& ro_long_value_cref2 = obj.ro_int_value2;
  const long long& long_value_cref = obj.int_value;
  const long long& long_value_cref2 = obj.int_value2;
  const long long& long_value_cref3 = obj.int_value3;
  
  EXPECT_EQ( 86, ro_long_value_cref );
  EXPECT_EQ( 86, ro_long_value_cref2 );
  EXPECT_EQ( 74, long_value_cref );
  EXPECT_EQ( 74, long_value_cref2 );
  EXPECT_EQ( 74, long_value_cref3 );
}